

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O0

void __thiscall
pbrt::Array2D<pbrt::GBufferFilm::Pixel>::~Array2D(Array2D<pbrt::GBufferFilm::Pixel> *this)

{
  int iVar1;
  Bounds2<int> *in_RDI;
  int i;
  int n;
  Pixel *in_stack_ffffffffffffffd8;
  int local_10;
  
  iVar1 = Bounds2<int>::Area(in_RDI);
  for (local_10 = 0; local_10 < iVar1; local_10 = local_10 + 1) {
    pstd::pmr::polymorphic_allocator<std::byte>::destroy<pbrt::GBufferFilm::Pixel>
              ((polymorphic_allocator<std::byte> *)(in_RDI + 1),
               (Pixel *)((long)in_RDI[1].pMax.super_Tuple2<pbrt::Point2,_int> +
                        (long)local_10 * 0xc0));
  }
  pstd::pmr::polymorphic_allocator<std::byte>::deallocate_object<pbrt::GBufferFilm::Pixel>
            ((polymorphic_allocator<std::byte> *)in_RDI,in_stack_ffffffffffffffd8,0x8cb998);
  return;
}

Assistant:

~Array2D() {
        int n = extent.Area();
        for (int i = 0; i < n; ++i)
            allocator.destroy(values + i);
        allocator.deallocate_object(values, n);
    }